

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O1

void __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,intervalVector *ivals,
          size_t depth,size_t minbucket,unsigned_long leftextent,unsigned_long rightextent,
          size_t maxbucket)

{
  unsigned_long uVar1;
  long lVar2;
  default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *this_00;
  default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *this_01;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false> minbucket_00;
  ulong uVar3;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *pIVar4;
  undefined8 uVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pIVar8;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *pIVar9;
  const_iterator i;
  size_t depth_00;
  intervalVector lefts;
  intervalVector rights;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> local_a8;
  unsigned_long local_78;
  unsigned_long local_70;
  default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *local_68;
  default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *local_60;
  intervalVector local_58;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false> local_38;
  
  local_68 = (default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *)
             &this->left;
  local_60 = (default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_> *)
             &this->right;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->left)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->right)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  depth_00 = depth - 1;
  local_a8.right._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
                  )(__uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
                    )rightextent;
  if (depth_00 != 0) {
    pIVar6 = (ivals->
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pIVar7 = (ivals->
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)pIVar7 - (long)pIVar6 >> 5;
    if (maxbucket <= uVar3 || minbucket <= uVar3) {
      local_78 = leftextent;
      local_38._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)minbucket
      ;
      if (rightextent == 0 && leftextent == 0) {
        local_78 = leftextent;
        if (pIVar6 != pIVar7) {
          lVar2 = 0x3f;
          if (uVar3 != 0) {
            for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>>
                    (pIVar6,pIVar7,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>>
                    (pIVar6,pIVar7);
        }
        if (rightextent == 0 && leftextent == 0) {
          pIVar6 = (ivals->
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar1 = pIVar6->start;
          local_a8.intervals.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.intervals.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.intervals.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,
                     (long)(ivals->
                           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >> 5);
          pIVar7 = (ivals->
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pIVar8 = local_a8.intervals.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (pIVar6 = (ivals->
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        )._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar7;
              pIVar6 = pIVar6 + 1) {
            pIVar8->start = pIVar6->stop;
            pIVar8 = (pointer)&pIVar8->stop;
          }
          pIVar6 = (pointer)&(local_a8.intervals.
                              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->stop;
          pIVar7 = local_a8.intervals.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar8 = local_a8.intervals.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pIVar6 != local_a8.intervals.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish &&
              local_a8.intervals.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_a8.intervals.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              pIVar7 = pIVar6;
              if (pIVar6->start <= pIVar8->start) {
                pIVar7 = pIVar8;
              }
              pIVar6 = (pointer)&pIVar6->stop;
              pIVar8 = pIVar7;
            } while (pIVar6 != local_a8.intervals.
                               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_a8.right._M_t.
          super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>,_true,_true>
                )pIVar7->start;
          local_78 = uVar1;
          if (local_a8.intervals.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.intervals.
                            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pIVar6 = (ivals->
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pIVar7 = (ivals->
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar7 != pIVar6) {
        local_70 = pIVar6[(ulong)((long)pIVar7 - (long)pIVar6 >> 5) >> 1].start;
        this->center = local_70;
        local_a8.intervals.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.intervals.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.intervals.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pIVar6 != (ivals->
                      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pIVar9 = &local_a8;
            if ((this->center <= pIVar6->stop) &&
               (pIVar9 = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&local_58,
               pIVar6->start <= this->center)) {
              pIVar9 = this;
            }
            std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::push_back(&pIVar9->intervals,pIVar6);
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != (ivals->
                             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
        minbucket_00._M_head_impl = local_38._M_head_impl;
        this_01 = local_60;
        this_00 = local_68;
        if (local_a8.intervals.
            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.intervals.
            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pIVar4 = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)operator_new(0x30);
          IntervalTree(pIVar4,&local_a8.intervals,depth_00,(size_t)minbucket_00._M_head_impl,
                       local_78,local_70,0x200);
          local_a8.center = 0;
          pIVar9 = *(IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> **)this_00;
          *(IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> **)this_00 = pIVar4;
          if (pIVar9 != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
            std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>::
            operator()(this_00,pIVar9);
          }
          std::
          unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                         *)&local_a8.center);
        }
        if (local_58.
            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.
            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pIVar4 = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)operator_new(0x30);
          IntervalTree(pIVar4,&local_58,depth_00,(size_t)minbucket_00._M_head_impl,local_70,
                       (unsigned_long)
                       local_a8.right._M_t.
                       super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                       .
                       super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
                       ._M_head_impl,0x200);
          local_a8.center = 0;
          pIVar9 = *(IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> **)this_01;
          *(IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> **)this_01 = pIVar4;
          if (pIVar9 != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
            std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>::
            operator()(this_01,pIVar9);
          }
          std::
          unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                         *)&local_a8.center);
        }
        std::
        vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ::~vector(&local_58);
        std::
        vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ::~vector(&local_a8.intervals);
        return;
      }
      uVar5 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_a8.intervals.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.intervals.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)local_60);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)local_68);
      std::
      vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~vector(&this->intervals);
      _Unwind_Resume(uVar5);
    }
  }
  pIVar6 = (ivals->
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (ivals->
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar6 != pIVar7) {
    uVar3 = (long)pIVar7 - (long)pIVar6 >> 5;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>>
              (pIVar6,pIVar7,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>>
              (pIVar6,pIVar7);
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->intervals,ivals);
  return;
}

Assistant:

IntervalTree<T,K>(
            intervalVector& ivals,
            std::size_t depth = 16,
            std::size_t minbucket = 64,
            K leftextent = 0,
            K rightextent = 0,
            std::size_t maxbucket = 512
            )
        : left(nullptr)
        , right(nullptr)
    {

        --depth;
        IntervalStartSorter<T,K> intervalStartSorter;
        if (depth == 0 || (ivals.size() < minbucket && ivals.size() < maxbucket)) {
            std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            intervals = ivals;
        } else {
            if (leftextent == 0 && rightextent == 0) {
                // sort intervals by start
              std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            }

            K leftp = 0;
            K rightp = 0;
            K centerp = 0;

            if (leftextent || rightextent) {
                leftp = leftextent;
                rightp = rightextent;
            } else {
                leftp = ivals.front().start;
                std::vector<K> stops;
                stops.resize(ivals.size());
                transform(ivals.begin(), ivals.end(), stops.begin(), intervalStop<T,K>);
                rightp = *max_element(stops.begin(), stops.end());
            }

            //centerp = ( leftp + rightp ) / 2;
            centerp = ivals.at(ivals.size() / 2).start;
            center = centerp;

            intervalVector lefts;
            intervalVector rights;

            for (typename intervalVector::const_iterator i = ivals.begin(); i != ivals.end(); ++i) {
                const interval& interval = *i;
                if (interval.stop < center) {
                    lefts.push_back(interval);
                } else if (interval.start > center) {
                    rights.push_back(interval);
                } else {
                    intervals.push_back(interval);
                }
            }

            if (!lefts.empty()) {
                left = std::unique_ptr<intervalTree>(new intervalTree(lefts, depth, minbucket, leftp, centerp));
            }
            if (!rights.empty()) {
                right = std::unique_ptr<intervalTree>(new intervalTree(rights, depth, minbucket, centerp, rightp));
            }
        }
    }